

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt_PackFontRangesRenderIntoRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  undefined4 uVar1;
  uint kernel_width;
  long lVar2;
  undefined2 *puVar3;
  undefined8 *puVar4;
  int in_ECX;
  undefined8 *puVar5;
  long in_RDX;
  long in_RDI;
  long in_R8;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float out_w;
  stbrp_coord pad;
  int glyph;
  int codepoint;
  int y1;
  int x1;
  int y0;
  int x0;
  int lsb;
  int advance;
  stbtt_packedchar *bc;
  stbrp_rect *r;
  float sub_y;
  float sub_x;
  float recip_v;
  float recip_h;
  float scale;
  float fh;
  int old_v_over;
  int old_h_over;
  int return_value;
  int missing_glyph;
  int k;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  int glyph_index;
  float scale_y;
  float in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffffa0;
  float unicode_codepoint;
  float fVar10;
  undefined4 uVar11;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  local_38 = -1;
  local_3c = 1;
  uVar1 = *(undefined4 *)(in_RDI + 0x24);
  uVar11 = *(undefined4 *)(in_RDI + 0x28);
  local_34 = 0;
  for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
    fVar10 = *(float *)(in_RDX + (long)local_2c * 0x28);
    if (fVar10 <= 0.0) {
      fVar6 = stbtt_ScaleForMappingEmToPixels
                        ((stbtt_fontinfo *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff5c);
    }
    else {
      fVar6 = stbtt_ScaleForPixelHeight
                        ((stbtt_fontinfo *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff5c);
    }
    *(uint *)(in_RDI + 0x24) = (uint)*(byte *)(in_RDX + 0x20 + (long)local_2c * 0x28);
    *(uint *)(in_RDI + 0x28) = (uint)*(byte *)(in_RDX + 0x21 + (long)local_2c * 0x28);
    fVar7 = 1.0 / (float)*(uint *)(in_RDI + 0x24);
    fVar8 = 1.0 / (float)*(uint *)(in_RDI + 0x28);
    unicode_codepoint = fVar6;
    fVar9 = stbtt__oversample_shift(*(int *)(in_RDI + 0x24));
    out_w = stbtt__oversample_shift(*(int *)(in_RDI + 0x28));
    for (local_30 = 0; local_30 < *(int *)(in_RDX + (long)local_2c * 0x28 + 0x10);
        local_30 = local_30 + 1) {
      lVar2 = in_R8 + (long)local_34 * 0x18;
      if (((*(int *)(lVar2 + 0x14) == 0) || (*(int *)(lVar2 + 4) == 0)) ||
         (*(int *)(lVar2 + 8) == 0)) {
        if (*(int *)(in_RDI + 0x20) == 0) {
          if (((*(int *)(lVar2 + 0x14) == 0) || (*(int *)(lVar2 + 4) != 0)) ||
             ((*(int *)(lVar2 + 8) != 0 || (local_38 < 0)))) {
            local_3c = 0;
          }
          else {
            puVar5 = (undefined8 *)
                     (*(long *)(in_RDX + (long)local_2c * 0x28 + 0x18) + (long)local_38 * 0x1c);
            puVar4 = (undefined8 *)
                     (*(long *)(in_RDX + (long)local_2c * 0x28 + 0x18) + (long)local_30 * 0x1c);
            *puVar4 = *puVar5;
            puVar4[1] = puVar5[1];
            puVar4[2] = puVar5[2];
            *(undefined4 *)(puVar4 + 3) = *(undefined4 *)(puVar5 + 3);
          }
        }
        else {
          local_3c = 0;
        }
      }
      else {
        puVar3 = (undefined2 *)
                 (*(long *)(in_RDX + (long)local_2c * 0x28 + 0x18) + (long)local_30 * 0x1c);
        if (*(long *)(in_RDX + (long)local_2c * 0x28 + 8) == 0) {
          in_stack_ffffffffffffff64 =
               (float)(*(int *)(in_RDX + (long)local_2c * 0x28 + 4) + local_30);
        }
        else {
          in_stack_ffffffffffffff64 =
               *(float *)(*(long *)(in_RDX + (long)local_2c * 0x28 + 8) + (long)local_30 * 4);
        }
        scale_y = in_stack_ffffffffffffff64;
        kernel_width = stbtt_FindGlyphIndex
                                 ((stbtt_fontinfo *)CONCAT44(uVar11,fVar10),(int)unicode_codepoint);
        glyph_index = *(int *)(in_RDI + 0x1c);
        *(int *)(lVar2 + 0xc) = *(int *)(lVar2 + 0xc) + glyph_index;
        *(int *)(lVar2 + 0x10) = *(int *)(lVar2 + 0x10) + glyph_index;
        *(int *)(lVar2 + 4) = *(int *)(lVar2 + 4) - glyph_index;
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) - glyph_index;
        stbtt_GetGlyphHMetrics
                  ((stbtt_fontinfo *)CONCAT44(scale_y,kernel_width),glyph_index,
                   (int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        stbtt_GetGlyphBitmapBox
                  ((stbtt_fontinfo *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,scale_y,
                   (int *)CONCAT44(glyph_index,fVar6),
                   (int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (int *)0x4dd8f9);
        stbtt_MakeGlyphBitmapSubpixel
                  ((stbtt_fontinfo *)CONCAT44(unicode_codepoint,fVar7),
                   (uchar *)CONCAT44(fVar8,fVar9),(int)out_w,in_stack_ffffffffffffffa0,
                   (int)((ulong)lVar2 >> 0x20),(float)lVar2,(float)((ulong)puVar3 >> 0x20),
                   SUB84(puVar3,0),in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
        if (1 < *(uint *)(in_RDI + 0x24)) {
          stbtt__h_prefilter((uchar *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff7c,(int)in_stack_ffffffffffffff78,(int)scale_y,
                             kernel_width);
        }
        if (1 < *(uint *)(in_RDI + 0x28)) {
          stbtt__v_prefilter((uchar *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff7c,(int)in_stack_ffffffffffffff78,(int)scale_y,
                             kernel_width);
        }
        *puVar3 = (short)*(undefined4 *)(lVar2 + 0xc);
        puVar3[1] = (short)*(undefined4 *)(lVar2 + 0x10);
        puVar3[2] = (short)*(undefined4 *)(lVar2 + 0xc) + (short)*(undefined4 *)(lVar2 + 4);
        puVar3[3] = (short)*(undefined4 *)(lVar2 + 0x10) + (short)*(undefined4 *)(lVar2 + 8);
        *(float *)(puVar3 + 8) = unicode_codepoint * (float)(int)in_stack_ffffffffffffff8c;
        *(float *)(puVar3 + 4) = (float)in_stack_ffffffffffffff84 * fVar7 + fVar9;
        *(float *)(puVar3 + 6) = (float)in_stack_ffffffffffffff80 * fVar8 + out_w;
        *(float *)(puVar3 + 10) =
             (float)(in_stack_ffffffffffffff84 + *(int *)(lVar2 + 4)) * fVar7 + fVar9;
        *(float *)(puVar3 + 0xc) =
             (float)(in_stack_ffffffffffffff80 + *(int *)(lVar2 + 8)) * fVar8 + out_w;
        if (kernel_width == 0) {
          local_38 = local_30;
        }
      }
      local_34 = local_34 + 1;
    }
  }
  *(undefined4 *)(in_RDI + 0x24) = uVar1;
  *(undefined4 *)(in_RDI + 0x28) = uVar11;
  return local_3c;
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesRenderIntoRects(stbtt_pack_context *spc, const stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
   int i,j,k, missing_glyph = -1, return_value = 1;

   // save current values
   int old_h_over = spc->h_oversample;
   int old_v_over = spc->v_oversample;

   k = 0;
   for (i=0; i < num_ranges; ++i) {
      float fh = ranges[i].font_size;
      float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
      float recip_h,recip_v,sub_x,sub_y;
      spc->h_oversample = ranges[i].h_oversample;
      spc->v_oversample = ranges[i].v_oversample;
      recip_h = 1.0f / spc->h_oversample;
      recip_v = 1.0f / spc->v_oversample;
      sub_x = stbtt__oversample_shift(spc->h_oversample);
      sub_y = stbtt__oversample_shift(spc->v_oversample);
      for (j=0; j < ranges[i].num_chars; ++j) {
         stbrp_rect *r = &rects[k];
         if (r->was_packed && r->w != 0 && r->h != 0) {
            stbtt_packedchar *bc = &ranges[i].chardata_for_range[j];
            int advance, lsb, x0,y0,x1,y1;
            int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
            int glyph = stbtt_FindGlyphIndex(info, codepoint);
            stbrp_coord pad = (stbrp_coord) spc->padding;

            // pad on left and top
            r->x += pad;
            r->y += pad;
            r->w -= pad;
            r->h -= pad;
            stbtt_GetGlyphHMetrics(info, glyph, &advance, &lsb);
            stbtt_GetGlyphBitmapBox(info, glyph,
                                    scale * spc->h_oversample,
                                    scale * spc->v_oversample,
                                    &x0,&y0,&x1,&y1);
            stbtt_MakeGlyphBitmapSubpixel(info,
                                          spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                          r->w - spc->h_oversample+1,
                                          r->h - spc->v_oversample+1,
                                          spc->stride_in_bytes,
                                          scale * spc->h_oversample,
                                          scale * spc->v_oversample,
                                          0,0,
                                          glyph);

            if (spc->h_oversample > 1)
               stbtt__h_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->h_oversample);

            if (spc->v_oversample > 1)
               stbtt__v_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->v_oversample);

            bc->x0       = (stbtt_int16)  r->x;
            bc->y0       = (stbtt_int16)  r->y;
            bc->x1       = (stbtt_int16) (r->x + r->w);
            bc->y1       = (stbtt_int16) (r->y + r->h);
            bc->xadvance =                scale * advance;
            bc->xoff     =       (float)  x0 * recip_h + sub_x;
            bc->yoff     =       (float)  y0 * recip_v + sub_y;
            bc->xoff2    =                (x0 + r->w) * recip_h + sub_x;
            bc->yoff2    =                (y0 + r->h) * recip_v + sub_y;

            if (glyph == 0)
               missing_glyph = j;
         } else if (spc->skip_missing) {
            return_value = 0;
         } else if (r->was_packed && r->w == 0 && r->h == 0 && missing_glyph >= 0) {
            ranges[i].chardata_for_range[j] = ranges[i].chardata_for_range[missing_glyph];
         } else {
            return_value = 0; // if any fail, report failure
         }

         ++k;
      }
   }

   // restore original values
   spc->h_oversample = old_h_over;
   spc->v_oversample = old_v_over;

   return return_value;
}